

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PSymbol * __thiscall PSymbolTable::FindSymbol(PSymbolTable *this,FName *symname,bool searchparents)

{
  PSymbol **ppPVar1;
  PSymbol *pPVar2;
  FName local_20;
  FName local_1c;
  
  local_1c = (FName)symname->Index;
  ppPVar1 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                      (&this->Symbols,&local_1c);
  if (ppPVar1 == (PSymbol **)0x0 && searchparents) {
    if (this->ParentSymbolTable != (PSymbolTable *)0x0) {
      local_20 = (FName)symname->Index;
      pPVar2 = FindSymbol(this->ParentSymbolTable,&local_20,true);
      return pPVar2;
    }
  }
  else if (ppPVar1 != (PSymbol **)0x0) {
    return *ppPVar1;
  }
  return (PSymbol *)0x0;
}

Assistant:

PSymbol *PSymbolTable::FindSymbol (FName symname, bool searchparents) const
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL && searchparents && ParentSymbolTable != NULL)
	{
		return ParentSymbolTable->FindSymbol(symname, searchparents);
	}
	return value != NULL ? *value : NULL;
}